

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertionResult *assertion_result;
  char *actual_predicate_value;
  long lVar2;
  long lVar3;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  long in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int i;
  iterator it;
  iterator *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  uint in_stack_fffffffffffff9d4;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9d8;
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  int line;
  char *file;
  Type type;
  AssertHelper *this_02;
  char *expected_predicate_value;
  char *expression_text;
  AssertHelper *this_03;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa70;
  AssertionResult local_508;
  value_type *in_stack_fffffffffffffb08;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb10;
  AssertionResult local_428;
  int local_414;
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_368;
  char local_300 [104];
  AssertHelper local_298 [39];
  char local_160 [104];
  char local_f8 [104];
  AssertHelper local_90 [18];
  
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07c64);
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  this_03 = local_90;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07cc1);
  actual_predicate_value = (char *)(in_RDI + 0x10);
  expression_text = local_f8;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07d12);
  expected_predicate_value = local_160;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07d63);
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07db4);
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07e05);
  lVar2 = in_RDI + 0x10;
  this_02 = local_298;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07e56);
  lVar3 = in_RDI + 0x10;
  file = local_300;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07ea7);
  this_00 = (HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  this_01 = &local_368;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(this_00,in_stack_fffffffffffff9d4);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xb07ef8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffa70);
  local_414 = 1;
  while( true ) {
    type = (Type)((ulong)lVar2 >> 0x20);
    line = (int)((ulong)lVar3 >> 0x20);
    if (9 < local_414) break;
    in_stack_fffffffffffff9d4 = in_stack_fffffffffffff9d4 & 0xffffff;
    if (local_414 != 0) {
      google::
      sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::operator++(this_01,(int)((ulong)this_00 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::end(in_stack_fffffffffffffa70);
      bVar1 = google::
              sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                           in_stack_fffffffffffff9c8);
      in_stack_fffffffffffff9d4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9d4);
    }
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               (bool *)in_stack_fffffffffffff9c8,(type *)0xb07fa9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_428);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_02,(Type)((ulong)lVar2 >> 0x20),file,(int)((ulong)lVar3 >> 0x20),
                 (char *)this_01);
      testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb08);
      testing::Message::~Message((Message *)0xb081c3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb08257);
    local_414 = local_414 + 1;
  }
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffa70);
  google::
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator==((sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
               in_stack_fffffffffffff9c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
             (bool *)in_stack_fffffffffffff9c8,(type *)0xb082cf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_508);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_02,type,file,line,(char *)this_01);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffa70);
    testing::Message::~Message((Message *)0xb08390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb0841e);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Iterating) {
  // Test a bit more iterating than just one ++.
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  typename TypeParam::iterator it = this->ht_.begin();
  for (int i = 1; i <= 9; i++) {  // start at 1 so i is never 0
    // && here makes it easier to tell what loop iteration the test failed on.
    EXPECT_TRUE(i && (it++ != this->ht_.end()));
  }
  EXPECT_TRUE(it == this->ht_.end());
}